

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O2

void __thiscall btDbvt::collideTT(btDbvt *this,btDbvtNode *root0,btDbvtNode *root1,ICollide *policy)

{
  long lVar1;
  btDbvtNode *a;
  btDbvtNode *pbVar2;
  long lVar3;
  btDbvtNode *pbVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  btAlignedObjectArray<btDbvt::sStkNN> stkStack;
  sStkNN local_40;
  
  if (root1 != (btDbvtNode *)0x0 && root0 != (btDbvtNode *)0x0) {
    stkStack.m_ownsMemory = true;
    stkStack.m_data = (sStkNN *)0x0;
    stkStack.m_size = 0;
    stkStack.m_capacity = 0;
    btAlignedObjectArray<btDbvt::sStkNN>::resize(&stkStack,0x80,&local_40);
    (stkStack.m_data)->a = root0;
    (stkStack.m_data)->b = root1;
    iVar8 = 1;
    iVar7 = 0x7c;
    do {
      lVar6 = (long)iVar8;
      iVar9 = iVar8 + -1;
      lVar1 = lVar6 + -1;
      a = stkStack.m_data[lVar1].a;
      pbVar2 = stkStack.m_data[lVar1].b;
      if (iVar7 < iVar9) {
        btAlignedObjectArray<btDbvt::sStkNN>::resize(&stkStack,stkStack.m_size * 2,&local_40);
        iVar7 = stkStack.m_size + -4;
      }
      if (a == pbVar2) {
        if (*(long *)((long)&a->field_2 + 8) != 0) {
          pbVar2 = (a->field_2).childs[0];
          stkStack.m_data[lVar1].a = pbVar2;
          stkStack.m_data[lVar1].b = pbVar2;
          pbVar2 = *(btDbvtNode **)((long)&a->field_2 + 8);
          stkStack.m_data[lVar6].a = pbVar2;
          stkStack.m_data[lVar6].b = pbVar2;
          pbVar2 = *(btDbvtNode **)((long)&a->field_2 + 8);
          stkStack.m_data[lVar6 + 1].a = (a->field_2).childs[0];
          stkStack.m_data[lVar6 + 1].b = pbVar2;
          iVar9 = iVar8 + 2;
        }
      }
      else {
        bVar5 = Intersect(&a->volume,&pbVar2->volume);
        if (bVar5) {
          lVar3 = *(long *)((long)&pbVar2->field_2 + 8);
          if (*(long *)((long)&a->field_2 + 8) == 0) {
            if (lVar3 == 0) {
              (*policy->_vptr_ICollide[2])(policy,a,pbVar2);
            }
            else {
              pbVar4 = (pbVar2->field_2).childs[0];
              stkStack.m_data[lVar1].a = a;
              stkStack.m_data[lVar1].b = pbVar4;
              pbVar2 = *(btDbvtNode **)((long)&pbVar2->field_2 + 8);
              stkStack.m_data[lVar6].a = a;
              stkStack.m_data[lVar6].b = pbVar2;
              iVar9 = iVar8 + 1;
            }
          }
          else if (lVar3 == 0) {
            stkStack.m_data[lVar1].a = (a->field_2).childs[0];
            stkStack.m_data[lVar1].b = pbVar2;
            stkStack.m_data[lVar6].a = *(btDbvtNode **)((long)&a->field_2 + 8);
            stkStack.m_data[lVar6].b = pbVar2;
            iVar9 = iVar8 + 1;
          }
          else {
            pbVar4 = (pbVar2->field_2).childs[0];
            stkStack.m_data[lVar1].a = (a->field_2).childs[0];
            stkStack.m_data[lVar1].b = pbVar4;
            pbVar4 = (pbVar2->field_2).childs[0];
            stkStack.m_data[lVar6].a = *(btDbvtNode **)((long)&a->field_2 + 8);
            stkStack.m_data[lVar6].b = pbVar4;
            pbVar4 = *(btDbvtNode **)((long)&pbVar2->field_2 + 8);
            stkStack.m_data[lVar6 + 1].a = (a->field_2).childs[0];
            stkStack.m_data[lVar6 + 1].b = pbVar4;
            pbVar2 = *(btDbvtNode **)((long)&pbVar2->field_2 + 8);
            stkStack.m_data[lVar6 + 2].a = *(btDbvtNode **)((long)&a->field_2 + 8);
            stkStack.m_data[lVar6 + 2].b = pbVar2;
            iVar9 = iVar8 + 3;
          }
        }
      }
      iVar8 = iVar9;
    } while (iVar8 != 0);
    btAlignedObjectArray<btDbvt::sStkNN>::~btAlignedObjectArray(&stkStack);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTT(	const btDbvtNode* root0,
								  const btDbvtNode* root1,
								  DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root0&&root1)
		{
			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-4;
			btAlignedObjectArray<sStkNN>	stkStack;
			stkStack.resize(DOUBLE_STACKSIZE);
			stkStack[0]=sStkNN(root0,root1);
			do	{		
				sStkNN	p=stkStack[--depth];
				if(depth>treshold)
				{
					stkStack.resize(stkStack.size()*2);
					treshold=stkStack.size()-4;
				}
				if(p.a==p.b)
				{
					if(p.a->isinternal())
					{
						stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[0]);
						stkStack[depth++]=sStkNN(p.a->childs[1],p.a->childs[1]);
						stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[1]);
					}
				}
				else if(Intersect(p.a->volume,p.b->volume))
				{
					if(p.a->isinternal())
					{
						if(p.b->isinternal())
						{
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[1]);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[1]);
						}
						else
						{
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b);
						}
					}
					else
					{
						if(p.b->isinternal())
						{
							stkStack[depth++]=sStkNN(p.a,p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a,p.b->childs[1]);
						}
						else
						{
							policy.Process(p.a,p.b);
						}
					}
				}
			} while(depth);
		}
}